

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Neuron.cpp
# Opt level: O1

bool __thiscall Neuron::tick(Neuron *this,float h)

{
  float fVar1;
  float fVar2;
  Neuron *this_00;
  pointer ppCVar3;
  pointer ppCVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  pointer pCVar9;
  Connection *this_01;
  float fVar10;
  double dVar11;
  float fVar12;
  
  fVar1 = this->m_prevMem;
  if (-40.0 < fVar1) {
    this->m_refractoryPeriod = true;
  }
  if (fVar1 <= 35.0) {
    fVar12 = (fVar1 + 60.0) * 0.5;
    fVar10 = this->m_expireSpeedNotFired;
    fVar2 = this->m_prevAdd;
    this->m_curMem =
         ((((fVar1 + 45.0) * fVar12 - fVar2) + this->m_extI + this->m_synI) / 50.0) * h + fVar1;
    this->m_curAdd = (fVar12 - fVar2) * 0.02 * h + fVar2;
    if ((fVar10 != 0.0) || (NAN(fVar10))) {
      dVar11 = exp((double)(-h / fVar10));
    }
    else {
      dVar11 = 1.0;
    }
    this->m_synI = (float)((double)this->m_synI * dVar11);
    fVar10 = this->m_prevMem;
    if ((-57.0 < fVar10) && (this->m_curMem <= -57.0)) {
      ppCVar3 = (this->m_incomingSpikes).
                super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppCVar4 = (this->m_incomingSpikes).
                super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      lVar8 = (long)ppCVar4 - (long)ppCVar3;
      if (lVar8 != 0) {
        lVar8 = lVar8 >> 3;
        lVar7 = 0;
        do {
          fVar2 = ppCVar3[lVar7]->m_weight;
          ppCVar3[lVar7]->m_weight = fVar2 + *(float *)(&DAT_00142b48 + (ulong)(fVar2 < 0.0) * 4);
          lVar7 = lVar7 + 1;
        } while (lVar8 + (ulong)(lVar8 == 0) != lVar7);
      }
      if (ppCVar4 != ppCVar3) {
        (this->m_incomingSpikes).super__Vector_base<Connection_*,_std::allocator<Connection_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = ppCVar3;
      }
    }
    if (fVar10 <= -60.0) {
      this->m_firing = false;
    }
    if ((this->m_firing == false) && (-60.0 < this->m_prevMem)) {
      this->m_refractoryPeriod = false;
    }
  }
  else {
    this->m_firing = true;
    this->m_curMem = -40.0;
    fVar10 = this->m_expireSpeedFired;
    this->m_curAdd = this->m_prevAdd + 100.0;
    if ((fVar10 != 0.0) || (NAN(fVar10))) {
      dVar11 = exp((double)(-h / fVar10));
    }
    else {
      dVar11 = 0.0;
    }
    this->m_synI = (float)((double)this->m_synI * dVar11);
    pCVar9 = (this->m_connections).super__Vector_base<Connection,_std::allocator<Connection>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->m_connections).super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
        super__Vector_impl_data._M_finish != pCVar9) {
      lVar8 = 0;
      uVar6 = 0;
      do {
        this_00 = *(Neuron **)((long)&pCVar9->m_target + lVar8);
        this_01 = (Connection *)((long)&pCVar9->m_target + lVar8);
        fVar10 = Connection::weight(this_01);
        apply(this_00,fVar10,this_01);
        uVar6 = uVar6 + 1;
        pCVar9 = (this->m_connections).super__Vector_base<Connection,_std::allocator<Connection>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar8 = lVar8 + 0x18;
      } while (uVar6 < (ulong)(((long)(this->m_connections).
                                      super__Vector_base<Connection,_std::allocator<Connection>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)pCVar9 >> 3)
                              * -0x5555555555555555));
    }
    ppCVar3 = (this->m_incomingSpikes).
              super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppCVar4 = (this->m_incomingSpikes).
              super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    lVar8 = (long)ppCVar4 - (long)ppCVar3;
    if (lVar8 != 0) {
      lVar8 = lVar8 >> 3;
      lVar7 = 0;
      do {
        fVar10 = ppCVar3[lVar7]->m_weight;
        ppCVar3[lVar7]->m_weight = fVar10 + *(float *)(&DAT_00142b50 + (ulong)(fVar10 < 0.0) * 4);
        lVar7 = lVar7 + 1;
      } while (lVar8 + (ulong)(lVar8 == 0) != lVar7);
    }
    if (ppCVar4 != ppCVar3) {
      (this->m_incomingSpikes).super__Vector_base<Connection_*,_std::allocator<Connection_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppCVar3;
    }
  }
  this->m_prevMem = this->m_curMem;
  this->m_prevAdd = this->m_curAdd;
  if (this->m_refractoryPeriod == false) {
    bVar5 = watchForSpiked(this);
    if (bVar5) {
      this->m_prevMem = 35.1;
    }
  }
  return 35.0 < fVar1;
}

Assistant:

bool Neuron::tick(float h)
{
    bool fired = m_prevMem > kSpikeThreshold;
    if (m_prevMem > kMembraneAfterSpike)
        m_refractoryPeriod = true;

    if (fired) {
        m_firing = true;
        m_curMem = kMembraneAfterSpike;
        m_curAdd = m_prevAdd + 100.0f;
        m_synI *= m_expireSpeedFired ? exp(-h / m_expireSpeedFired) : 0;

        for (size_t i = 0; i < m_connections.size(); ++i)
            m_connections[i].spike();

        for (size_t i = 0; i < m_incomingSpikes.size(); ++i)
            m_incomingSpikes[i]->teach(1);

        m_incomingSpikes.clear();
    } else {
        m_curMem = m_prevMem + h * prevMem();
        m_curAdd = m_prevAdd + h * prevAdd();
        m_synI *= m_expireSpeedNotFired ? exp(-h / m_expireSpeedNotFired) : 1;

        // All prev spikes could not activate current neuron.
        // TODO: val should be param?
        const float activateThreshold = -57.0f;
        if (m_prevMem > activateThreshold && m_curMem <= activateThreshold) {
            for (size_t i = 0; i < m_incomingSpikes.size(); ++i)
                m_incomingSpikes[i]->teach(-1);

            m_incomingSpikes.clear();
        }

        if (m_prevMem <= kDefaultMembrane)
            m_firing = false;

        if (!m_firing && m_prevMem > kDefaultMembrane)
            m_refractoryPeriod = false;
    }

    m_prevMem = m_curMem;
    m_prevAdd = m_curAdd;

    if (!m_refractoryPeriod && watchForSpiked())
        spike();

    return fired;
}